

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::SourceCodeInfo::SourceCodeInfo(SourceCodeInfo *this,SourceCodeInfo *from)

{
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__SourceCodeInfo_0020d690;
  UnknownFieldSet::UnknownFieldSet(&this->_unknown_fields_);
  (this->location_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->location_).super_RepeatedPtrFieldBase.elements_ = (void **)0x0;
  (this->location_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->location_).super_RepeatedPtrFieldBase.allocated_size_ = 0;
  this->_cached_size_ = 0;
  this->_has_bits_[0] = 0;
  MergeFrom(this,from);
  return;
}

Assistant:

SourceCodeInfo::SourceCodeInfo(const SourceCodeInfo& from)
  : ::google::protobuf::Message() {
  SharedCtor();
  MergeFrom(from);
}